

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  float fVar4;
  uint uVar5;
  Buffer *pBVar6;
  BufferView *pBVar7;
  Accessor *pAVar8;
  float *pfVar9;
  reference pvVar10;
  ulong uVar11;
  Ref<glTF::BufferView> RVar12;
  Ref<glTF::Accessor> RVar13;
  float local_108;
  uint local_104;
  uint j;
  uint i_1;
  float valueTmp;
  value_type_conflict6 local_f4;
  uint i;
  float float_MAX;
  uint local_e8;
  string local_e0;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *local_c0;
  uint local_b8;
  string local_a0;
  undefined1 local_80 [8];
  Ref<glTF::BufferView> bv;
  size_t length;
  size_t padding;
  size_t offset;
  uint bytesPerComp;
  uint numCompsOut;
  uint numCompsIn;
  bool isIndices_local;
  Value typeIn_local;
  void *data_local;
  uint count_local;
  Ref<glTF::Buffer> *buffer_local;
  string *meshName_local;
  Asset *a_local;
  Ref<glTF::Accessor> acc;
  
  if ((count == 0) || (data == (void *)0x0)) {
    glTF::Ref<glTF::Accessor>::Ref((Ref<glTF::Accessor> *)&a_local);
  }
  else {
    uVar3 = glTF::AttribType::GetNumComponents(typeIn);
    fVar4 = (float)glTF::AttribType::GetNumComponents(typeOut);
    uVar5 = glTF::ComponentTypeSize(compType);
    pBVar6 = glTF::Ref<glTF::Buffer>::operator->(buffer);
    uVar1 = pBVar6->byteLength;
    uVar11 = uVar1 % (ulong)uVar5;
    bv._8_8_ = ZEXT48(count * (int)fVar4 * uVar5);
    pBVar6 = glTF::Ref<glTF::Buffer>::operator->(buffer);
    glTF::Buffer::Grow(pBVar6,bv._8_8_ + uVar11);
    glTF::Asset::FindUniqueID(&local_a0,a,meshName,"view");
    RVar12 = glTF::LazyDict<glTF::BufferView>::Create(&a->bufferViews,&local_a0);
    local_c0 = RVar12.vector;
    local_b8 = RVar12.index;
    local_80 = (undefined1  [8])local_c0;
    bv.vector._0_4_ = local_b8;
    std::__cxx11::string::~string((string *)&local_a0);
    pBVar7 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    (pBVar7->buffer).index = buffer->index;
    (pBVar7->buffer).vector = buffer->vector;
    pBVar7 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    uVar2 = bv._8_8_;
    pBVar7->byteOffset = uVar1 + uVar11 & 0xffffffff;
    pBVar7 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    pBVar7->byteLength = uVar2;
    pBVar7 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    pBVar7->target = isIndices & 1 | BufferViewTarget_ARRAY_BUFFER;
    glTF::Asset::FindUniqueID(&local_e0,a,meshName,"accessor");
    RVar13 = glTF::LazyDict<glTF::Accessor>::Create(&a->accessors,&local_e0);
    _i = (Asset *)RVar13.vector;
    local_e8 = RVar13.index;
    a_local = _i;
    acc.vector._0_4_ = local_e8;
    std::__cxx11::string::~string((string *)&local_e0);
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    (pAVar8->bufferView).vector =
         (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)local_80;
    (pAVar8->bufferView).index = (uint)bv.vector;
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar8->byteOffset = 0;
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar8->byteStride = 0;
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar8->componentType = compType;
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar8->count = count;
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar8->type = typeOut;
    local_f4 = 1e+13;
    for (valueTmp = 0.0; (uint)valueTmp < (uint)fVar4; valueTmp = (float)((int)valueTmp + 1)) {
      pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
      std::vector<float,_std::allocator<float>_>::push_back(&pAVar8->min,&local_f4);
      pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
      i_1 = (uint)-local_f4;
      std::vector<float,_std::allocator<float>_>::push_back
                (&pAVar8->max,(value_type_conflict6 *)&i_1);
    }
    for (local_104 = 0; local_104 < count; local_104 = local_104 + 1) {
      for (local_108 = 0.0; (uint)local_108 < (uint)fVar4; local_108 = (float)((int)local_108 + 1))
      {
        if (fVar4 == 1.4013e-45) {
          j = (uint)(float)*(ushort *)((long)data + (ulong)local_104 * 2);
        }
        else {
          pfVar9 = aiVector3t<float>::operator[]
                             ((aiVector3t<float> *)((long)data + (ulong)local_104 * 0xc),
                              (uint)local_108);
          j = (uint)*pfVar9;
        }
        pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&pAVar8->min,(ulong)(uint)local_108);
        if ((float)j < *pvVar10) {
          pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&pAVar8->min,(ulong)(uint)local_108);
          *pvVar10 = (value_type)j;
        }
        pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&pAVar8->max,(ulong)(uint)local_108);
        if (*pvVar10 <= (float)j && (float)j != *pvVar10) {
          pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&pAVar8->max,(ulong)(uint)local_108);
          *pvVar10 = (value_type)j;
        }
      }
    }
    pAVar8 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    glTF::Accessor::WriteData(pAVar8,(ulong)count,data,(ulong)(uVar3 * uVar5));
  }
  RVar13.index = (uint)acc.vector;
  RVar13.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)a_local;
  RVar13._12_4_ = 0;
  return RVar13;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
    {
        // Allocate and initialize with large values.
        float float_MAX = 10000000000000.0f;
        for (unsigned int i = 0 ; i < numCompsOut ; i++) {
            acc->min.push_back( float_MAX);
            acc->max.push_back(-float_MAX);
        }

        // Search and set extreme values.
        float valueTmp;
        for (unsigned int i = 0 ; i < count       ; i++) {
            for (unsigned int j = 0 ; j < numCompsOut ; j++) {
                if (numCompsOut == 1) {
                  valueTmp = static_cast<unsigned short*>(data)[i];
                } else {
                  valueTmp = static_cast<aiVector3D*>(data)[i][j];
                }

                if (valueTmp < acc->min[j]) {
                    acc->min[j] = valueTmp;
                }
                if (valueTmp > acc->max[j]) {
                    acc->max[j] = valueTmp;
                }
            }
        }
    }

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}